

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

void __thiscall
bloaty::anon_unknown_0::ElfFile::ReadSegment(ElfFile *this,Elf64_Word index,Segment *segment)

{
  Elf64_Off *pEVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  undefined8 uVar12;
  Elf64_Off EVar13;
  Elf64_Addr EVar14;
  Elf64_Addr EVar15;
  Elf64_Xword EVar16;
  Elf64_Xword EVar17;
  ulong uVar18;
  ulong uVar19;
  Nonnull<char_*> pcVar20;
  ulong uVar21;
  Arg *in_R9;
  string_view sVar22;
  string_view format;
  string local_90;
  Arg local_70;
  long local_40;
  Nonnull<char_*> local_38;
  char local_30 [32];
  
  if ((this->header_).e_phnum <= index) {
    pcVar20 = absl::numbers_internal::FastIntToBuffer(index,local_30);
    local_40 = (long)pcVar20 - (long)local_30;
    pcVar11 = local_70.scratch_;
    local_38 = local_30;
    pcVar20 = absl::numbers_internal::FastIntToBuffer((uint)(this->header_).e_phnum,pcVar11);
    local_70.piece_._M_len = (long)pcVar20 - (long)pcVar11;
    format._M_str = (char *)&local_40;
    format._M_len = (size_t)"segment $0 doesn\'t exist, only $1 segments";
    local_70.piece_._M_str = pcVar11;
    absl::Substitute_abi_cxx11_(&local_90,(absl *)0x2a,format,&local_70,in_R9);
    Throw(local_90._M_dataplus._M_p,0x20e);
  }
  uVar18 = (ulong)(this->header_).e_phentsize * (ulong)index;
  pEVar1 = &(this->header_).e_phoff;
  uVar19 = uVar18 + *pEVar1;
  if (CARRY8(uVar18,*pEVar1)) {
LAB_00198e89:
    Throw("integer overflow in addition",0x4b);
  }
  uVar18 = (this->data_)._M_len;
  pcVar11 = (this->data_)._M_str;
  if (this->is_64bit_ == true) {
    if (0xffffffffffffffc7 < uVar19) goto LAB_00198e89;
    if (uVar18 < uVar19 + 0x38) {
LAB_00198f01:
      Throw("region out-of-bounds",0x5d);
    }
    bVar2 = this->is_native_endian_;
    uVar21 = 0x38;
    if (uVar18 - uVar19 < 0x38) {
      uVar21 = uVar18 - uVar19;
    }
    (segment->range_)._M_len = uVar21;
    (segment->range_)._M_str = pcVar11 + uVar19;
    uVar12 = *(undefined8 *)(pcVar11 + uVar19);
    EVar13 = *(Elf64_Off *)(pcVar11 + uVar19 + 8);
    EVar14 = *(Elf64_Addr *)(pcVar11 + uVar19 + 0x10);
    EVar15 = *(Elf64_Addr *)((long)(pcVar11 + uVar19 + 0x10) + 8);
    EVar16 = *(Elf64_Xword *)(pcVar11 + uVar19 + 0x20);
    EVar17 = *(Elf64_Xword *)((long)(pcVar11 + uVar19 + 0x20) + 8);
    (segment->header_).p_type = (int)uVar12;
    (segment->header_).p_flags = (int)((ulong)uVar12 >> 0x20);
    (segment->header_).p_offset = EVar13;
    (segment->header_).p_vaddr = EVar14;
    (segment->header_).p_paddr = EVar15;
    (segment->header_).p_filesz = EVar16;
    (segment->header_).p_memsz = EVar17;
    (segment->header_).p_align = *(Elf64_Xword *)(pcVar11 + uVar19 + 0x30);
    if (bVar2 != false) {
      uVar18 = (segment->header_).p_filesz;
      goto LAB_00198e60;
    }
    uVar9 = (segment->header_).p_type;
    uVar10 = (segment->header_).p_flags;
    (segment->header_).p_type =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    (segment->header_).p_flags =
         uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    uVar18 = (segment->header_).p_offset;
    (segment->header_).p_offset =
         uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 | (uVar18 & 0xff0000000000) >> 0x18 |
         (uVar18 & 0xff00000000) >> 8 | (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
         (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
    uVar18 = (segment->header_).p_vaddr;
    (segment->header_).p_vaddr =
         uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 | (uVar18 & 0xff0000000000) >> 0x18 |
         (uVar18 & 0xff00000000) >> 8 | (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
         (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
    uVar18 = (segment->header_).p_paddr;
    (segment->header_).p_paddr =
         uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 | (uVar18 & 0xff0000000000) >> 0x18 |
         (uVar18 & 0xff00000000) >> 8 | (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
         (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
    uVar18 = (segment->header_).p_filesz;
    uVar18 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
             (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
             (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 | (uVar18 & 0xff00) << 0x28 |
             uVar18 << 0x38;
    (segment->header_).p_filesz = uVar18;
    uVar19 = (segment->header_).p_memsz;
    (segment->header_).p_memsz =
         uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 | (uVar19 & 0xff0000000000) >> 0x18 |
         (uVar19 & 0xff00000000) >> 8 | (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
         (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
    uVar19 = (segment->header_).p_align;
    uVar19 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
             (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
             (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28 |
             uVar19 << 0x38;
  }
  else {
    if (0xffffffffffffffdf < uVar19) goto LAB_00198e89;
    if (uVar18 < uVar19 + 0x20) goto LAB_00198f01;
    uVar21 = 0x20;
    if (uVar18 - uVar19 < 0x20) {
      uVar21 = uVar18 - uVar19;
    }
    (segment->range_)._M_len = uVar21;
    (segment->range_)._M_str = pcVar11 + uVar19;
    uVar9 = *(uint *)(pcVar11 + uVar19);
    uVar10 = *(uint *)(pcVar11 + uVar19 + 4);
    uVar3 = *(uint *)(pcVar11 + uVar19 + 8);
    uVar4 = *(uint *)(pcVar11 + uVar19 + 0xc);
    uVar5 = *(uint *)(pcVar11 + uVar19 + 0x10);
    uVar18 = (ulong)uVar5;
    uVar6 = *(uint *)(pcVar11 + uVar19 + 0x14);
    uVar7 = *(uint *)(pcVar11 + uVar19 + 0x18);
    uVar8 = *(uint *)(pcVar11 + uVar19 + 0x1c);
    uVar19 = (ulong)uVar8;
    if (this->is_native_endian_ == true) {
      (segment->header_).p_type = uVar9;
      (segment->header_).p_flags = uVar7;
      (segment->header_).p_offset = (ulong)uVar10;
      (segment->header_).p_vaddr = (ulong)uVar3;
      (segment->header_).p_paddr = (ulong)uVar4;
      (segment->header_).p_filesz = uVar18;
      (segment->header_).p_memsz = (ulong)uVar6;
    }
    else {
      (segment->header_).p_type =
           uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
      (segment->header_).p_flags =
           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      (segment->header_).p_offset =
           (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                  uVar10 << 0x18);
      (segment->header_).p_vaddr =
           (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18);
      (segment->header_).p_paddr =
           (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
      uVar18 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                      uVar5 << 0x18);
      (segment->header_).p_filesz = uVar18;
      (segment->header_).p_memsz =
           (ulong)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18);
      uVar19 = (ulong)(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                      uVar8 << 0x18);
    }
  }
  (segment->header_).p_align = uVar19;
LAB_00198e60:
  if (uVar18 != 0) {
    sVar22 = GetRegion((ElfFile *)(this->data_)._M_len,(uint64_t)(this->data_)._M_str,
                       (segment->header_).p_offset);
    segment->contents_ = sVar22;
  }
  return;
}

Assistant:

void ElfFile::ReadSegment(Elf64_Word index, Segment* segment) const {
  if (index >= header_.e_phnum) {
    THROWF("segment $0 doesn't exist, only $1 segments", index,
           header_.e_phnum);
  }

  Elf64_Phdr* header = &segment->header_;
  ReadStruct<Elf32_Phdr>(
      entire_file(),
      CheckedAdd(header_.e_phoff, CheckedMul(header_.e_phentsize, index)),
      PhdrMunger(), &segment->range_, header);
  if (header->p_filesz > 0) {
    segment->contents_ = GetRegion(header->p_offset, header->p_filesz);
  }
}